

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O1

void __thiscall QTabWidgetPrivate::showTab(QTabWidgetPrivate *this,int index)

{
  QObject *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_3c;
  void *local_38;
  int *piStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  iVar2 = QStackedWidget::count(this->stack);
  if ((-1 < index) && (index < iVar2)) {
    QStackedWidget::setCurrentIndex(this->stack,index);
  }
  piStack_30 = &local_3c;
  local_38 = (void *)0x0;
  local_3c = index;
  QMetaObject::activate(pQVar1,&QTabWidget::staticMetaObject,0,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidgetPrivate::showTab(int index)
{
    Q_Q(QTabWidget);
    if (index < stack->count() && index >= 0)
        stack->setCurrentIndex(index);
    emit q->currentChanged(index);
}